

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_util.h
# Opt level: O2

void bitset_flip_range(uint64_t *words,uint32_t start,uint32_t end)

{
  ulong uVar1;
  uint32_t i;
  ulong uVar2;
  
  if (start != end) {
    uVar2 = (ulong)(start >> 6);
    uVar1 = (ulong)(end - 1 >> 6);
    words[uVar2] = ~(-1L << ((byte)start & 0x3f) ^ words[uVar2]);
    for (; uVar2 < uVar1; uVar2 = uVar2 + 1) {
      words[uVar2] = ~words[uVar2];
    }
    words[uVar1] = words[uVar1] ^ 0xffffffffffffffffU >> (-(char)end & 0x3fU);
  }
  return;
}

Assistant:

static inline void bitset_flip_range(uint64_t *words, uint32_t start,
                                     uint32_t end) {
    if (start == end) return;
    uint32_t firstword = start / 64;
    uint32_t endword = (end - 1) / 64;
    words[firstword] ^= ~((~UINT64_C(0)) << (start % 64));
    for (uint32_t i = firstword; i < endword; i++) {
        words[i] = ~words[i];
    }
    words[endword] ^= ((~UINT64_C(0)) >> ((~end + 1) % 64));
}